

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

uint rtcGetGeometryPreviousHalfEdge(RTCGeometry hgeometry,uint edgeID)

{
  uint uVar1;
  
  uVar1 = (**(code **)(*(long *)hgeometry + 0xd8))();
  return uVar1;
}

Assistant:

RTC_API unsigned int rtcGetGeometryPreviousHalfEdge(RTCGeometry hgeometry, unsigned int edgeID)
  {
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcGetGeometryPreviousHalfEdge);
    //RTC_ENTER_DEVICE(hgeometry); // do not enable for performance reasons
    return geometry->getPreviousHalfEdge(edgeID);
    RTC_CATCH_END2(geometry);
    return -1;
  }